

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode Curl_sasl_create_digest_md5_message
                   (SessionHandle *data,char *chlg64,char *userp,char *passwdp,char *service,
                   char **outptr,size_t *outlen)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  MD5_context *pMVar4;
  size_t sVar5;
  uchar *data_00;
  char *inputbuff;
  undefined4 uVar6;
  char *spn;
  undefined1 local_29f;
  uchar auStack_29e [3];
  char qop [5];
  char method [13];
  char nonceCount [9];
  uint entropy [4];
  char cnonce [33];
  uint local_24c;
  char local_248 [4];
  int qop_values;
  char qop_options [64];
  char algorithm [64];
  char realm [128];
  char nonce [64];
  char resp_hash_hex [33];
  uchar local_d8 [8];
  char HA2_hex [33];
  uchar local_a8 [8];
  char HA1_hex [33];
  byte local_78 [8];
  uchar digest [16];
  char *response;
  MD5_context *ctxt;
  size_t i;
  CURLcode result;
  char **outptr_local;
  char *service_local;
  char *passwdp_local;
  char *userp_local;
  char *chlg64_local;
  SessionHandle *data_local;
  
  builtin_strncpy(method + 5,"00000001",8);
  auStack_29e[0] = 'A';
  auStack_29e[1] = 'U';
  auStack_29e[2] = 'T';
  builtin_strncpy(qop,"HENTI",5);
  builtin_strncpy(method,"CATE",5);
  stack0xfffffffffffffd5d = 0x68747561;
  local_29f = 0;
  uVar6 = 0;
  data_local._4_4_ =
       sasl_decode_digest_md5_message
                 (chlg64,realm + 0x78,0x40,algorithm + 0x38,0x80,qop_options + 0x38,0x40,local_248,
                  0x40);
  if (data_local._4_4_ == CURLE_OK) {
    iVar1 = strcmp(qop_options + 0x38,"md5-sess");
    if (iVar1 == 0) {
      data_local._4_4_ = sasl_digest_get_qop_values(local_248,(int *)&local_24c);
      if (data_local._4_4_ == CURLE_OK) {
        if ((local_24c & 1) == 0) {
          data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
        }
        else {
          uVar2 = Curl_rand(data);
          uVar3 = Curl_rand(data);
          entropy[0] = Curl_rand(data);
          entropy[1] = Curl_rand(data);
          curl_msnprintf((char *)(entropy + 2),0x21,"%08x%08x%08x%08x",(ulong)uVar2,(ulong)uVar3,
                         (ulong)entropy[0],CONCAT44(uVar6,entropy[1]));
          pMVar4 = Curl_MD5_init(Curl_DIGEST_MD5);
          if (pMVar4 == (MD5_context *)0x0) {
            data_local._4_4_ = CURLE_OUT_OF_MEMORY;
          }
          else {
            sVar5 = strlen(userp);
            uVar2 = curlx_uztoui(sVar5);
            Curl_MD5_update(pMVar4,(uchar *)userp,uVar2);
            Curl_MD5_update(pMVar4,":",1);
            sVar5 = strlen(algorithm + 0x38);
            uVar2 = curlx_uztoui(sVar5);
            Curl_MD5_update(pMVar4,(uchar *)(algorithm + 0x38),uVar2);
            Curl_MD5_update(pMVar4,":",1);
            sVar5 = strlen(passwdp);
            uVar2 = curlx_uztoui(sVar5);
            Curl_MD5_update(pMVar4,(uchar *)passwdp,uVar2);
            Curl_MD5_final(pMVar4,local_78);
            pMVar4 = Curl_MD5_init(Curl_DIGEST_MD5);
            if (pMVar4 == (MD5_context *)0x0) {
              data_local._4_4_ = CURLE_OUT_OF_MEMORY;
            }
            else {
              Curl_MD5_update(pMVar4,local_78,0x10);
              Curl_MD5_update(pMVar4,":",1);
              sVar5 = strlen(realm + 0x78);
              uVar2 = curlx_uztoui(sVar5);
              Curl_MD5_update(pMVar4,(uchar *)(realm + 0x78),uVar2);
              Curl_MD5_update(pMVar4,":",1);
              sVar5 = strlen((char *)(entropy + 2));
              uVar2 = curlx_uztoui(sVar5);
              Curl_MD5_update(pMVar4,(uchar *)(entropy + 2),uVar2);
              Curl_MD5_final(pMVar4,local_78);
              for (ctxt = (MD5_context *)0x0; ctxt < (MD5_context *)0x10;
                  ctxt = (MD5_context *)((long)&ctxt->md5_hash + 1)) {
                curl_msnprintf((char *)(local_a8 + (long)ctxt * 2),3,"%02x",
                               (ulong)local_78[(long)ctxt]);
              }
              data_00 = (uchar *)Curl_sasl_build_spn(service,algorithm + 0x38);
              if (data_00 == (uchar *)0x0) {
                data_local._4_4_ = CURLE_OUT_OF_MEMORY;
              }
              else {
                pMVar4 = Curl_MD5_init(Curl_DIGEST_MD5);
                if (pMVar4 == (MD5_context *)0x0) {
                  if (data_00 != (uchar *)0x0) {
                    (*Curl_cfree)(data_00);
                  }
                  data_local._4_4_ = CURLE_OUT_OF_MEMORY;
                }
                else {
                  sVar5 = strlen((char *)auStack_29e);
                  uVar2 = curlx_uztoui(sVar5);
                  Curl_MD5_update(pMVar4,auStack_29e,uVar2);
                  Curl_MD5_update(pMVar4,":",1);
                  sVar5 = strlen((char *)data_00);
                  uVar2 = curlx_uztoui(sVar5);
                  Curl_MD5_update(pMVar4,data_00,uVar2);
                  Curl_MD5_final(pMVar4,local_78);
                  for (ctxt = (MD5_context *)0x0; ctxt < (MD5_context *)0x10;
                      ctxt = (MD5_context *)((long)&ctxt->md5_hash + 1)) {
                    curl_msnprintf((char *)(local_d8 + (long)ctxt * 2),3,"%02x",
                                   (ulong)local_78[(long)ctxt]);
                  }
                  pMVar4 = Curl_MD5_init(Curl_DIGEST_MD5);
                  if (pMVar4 == (MD5_context *)0x0) {
                    if (data_00 != (uchar *)0x0) {
                      (*Curl_cfree)(data_00);
                    }
                    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
                  }
                  else {
                    Curl_MD5_update(pMVar4,local_a8,0x20);
                    Curl_MD5_update(pMVar4,":",1);
                    sVar5 = strlen(realm + 0x78);
                    uVar2 = curlx_uztoui(sVar5);
                    Curl_MD5_update(pMVar4,(uchar *)(realm + 0x78),uVar2);
                    Curl_MD5_update(pMVar4,":",1);
                    sVar5 = strlen(method + 5);
                    uVar2 = curlx_uztoui(sVar5);
                    Curl_MD5_update(pMVar4,(uchar *)(method + 5),uVar2);
                    Curl_MD5_update(pMVar4,":",1);
                    sVar5 = strlen((char *)(entropy + 2));
                    uVar2 = curlx_uztoui(sVar5);
                    Curl_MD5_update(pMVar4,(uchar *)(entropy + 2),uVar2);
                    Curl_MD5_update(pMVar4,":",1);
                    sVar5 = strlen((char *)((long)&spn + 5));
                    uVar2 = curlx_uztoui(sVar5);
                    Curl_MD5_update(pMVar4,(uchar *)((long)&spn + 5),uVar2);
                    Curl_MD5_update(pMVar4,":",1);
                    Curl_MD5_update(pMVar4,local_d8,0x20);
                    Curl_MD5_final(pMVar4,local_78);
                    for (ctxt = (MD5_context *)0x0; ctxt < (MD5_context *)0x10;
                        ctxt = (MD5_context *)((long)&ctxt->md5_hash + 1)) {
                      curl_msnprintf(resp_hash_hex + (long)ctxt * 2 + -8,3,"%02x",
                                     (ulong)local_78[(long)ctxt]);
                    }
                    inputbuff = curl_maprintf("username=\"%s\",realm=\"%s\",nonce=\"%s\",cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,qop=%s"
                                              ,userp,algorithm + 0x38,realm + 0x78,entropy + 2,
                                              method + 5,data_00,nonce + 0x38,(long)&spn + 5);
                    if (data_00 != (uchar *)0x0) {
                      (*Curl_cfree)(data_00);
                    }
                    if (inputbuff == (char *)0x0) {
                      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
                    }
                    else {
                      data_local._4_4_ = Curl_base64_encode(data,inputbuff,0,outptr,outlen);
                      if (inputbuff != (char *)0x0) {
                        (*Curl_cfree)(inputbuff);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_sasl_create_digest_md5_message(struct SessionHandle *data,
                                             const char *chlg64,
                                             const char *userp,
                                             const char *passwdp,
                                             const char *service,
                                             char **outptr, size_t *outlen)
{
  CURLcode result = CURLE_OK;
  size_t i;
  MD5_context *ctxt;
  char *response = NULL;
  unsigned char digest[MD5_DIGEST_LEN];
  char HA1_hex[2 * MD5_DIGEST_LEN + 1];
  char HA2_hex[2 * MD5_DIGEST_LEN + 1];
  char resp_hash_hex[2 * MD5_DIGEST_LEN + 1];
  char nonce[64];
  char realm[128];
  char algorithm[64];
  char qop_options[64];
  int qop_values;
  char cnonce[33];
  unsigned int entropy[4];
  char nonceCount[] = "00000001";
  char method[]     = "AUTHENTICATE";
  char qop[]        = DIGEST_QOP_VALUE_STRING_AUTH;
  char *spn         = NULL;

  /* Decode the challange message */
  result = sasl_decode_digest_md5_message(chlg64, nonce, sizeof(nonce),
                                          realm, sizeof(realm),
                                          algorithm, sizeof(algorithm),
                                          qop_options, sizeof(qop_options));
  if(result)
    return result;

  /* We only support md5 sessions */
  if(strcmp(algorithm, "md5-sess") != 0)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Get the qop-values from the qop-options */
  result = sasl_digest_get_qop_values(qop_options, &qop_values);
  if(result)
    return result;

  /* We only support auth quality-of-protection */
  if(!(qop_values & DIGEST_QOP_VALUE_AUTH))
    return CURLE_BAD_CONTENT_ENCODING;

  /* Generate 16 bytes of random data */
  entropy[0] = Curl_rand(data);
  entropy[1] = Curl_rand(data);
  entropy[2] = Curl_rand(data);
  entropy[3] = Curl_rand(data);

  /* Convert the random data into a 32 byte hex string */
  snprintf(cnonce, sizeof(cnonce), "%08x%08x%08x%08x",
           entropy[0], entropy[1], entropy[2], entropy[3]);

  /* So far so good, now calculate A1 and H(A1) according to RFC 2831 */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) userp,
                  curlx_uztoui(strlen(userp)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) realm,
                  curlx_uztoui(strlen(realm)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) passwdp,
                  curlx_uztoui(strlen(passwdp)));
  Curl_MD5_final(ctxt, digest);

  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) digest, MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_final(ctxt, digest);

  /* Convert calculated 16 octet hex into 32 bytes string */
  for(i = 0; i < MD5_DIGEST_LEN; i++)
    snprintf(&HA1_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate our SPN */
  spn = Curl_sasl_build_spn(service, realm);
  if(!spn)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate H(A2) */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt) {
    Curl_safefree(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) method,
                  curlx_uztoui(strlen(method)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) spn,
                  curlx_uztoui(strlen(spn)));
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    snprintf(&HA2_hex[2 * i], 3, "%02x", digest[i]);

  /* Now calculate the response hash */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt) {
    Curl_safefree(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) HA1_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) nonceCount,
                  curlx_uztoui(strlen(nonceCount)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) qop,
                  curlx_uztoui(strlen(qop)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) HA2_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    snprintf(&resp_hash_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate the response */
  response = aprintf("username=\"%s\",realm=\"%s\",nonce=\"%s\","
                     "cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,"
                     "qop=%s",
                     userp, realm, nonce,
                     cnonce, nonceCount, spn, resp_hash_hex, qop);
  Curl_safefree(spn);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Base64 encode the response */
  result = Curl_base64_encode(data, response, 0, outptr, outlen);

  Curl_safefree(response);

  return result;
}